

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcprsstm.cpp
# Opt level: O1

void __thiscall CTPNStmTryBase::add_catch(CTPNStmTryBase *this,CTPNStmCatch *catch_stm)

{
  CTPNStmCatch **ppCVar1;
  
  ppCVar1 = &(this->last_catch_stm_->super_CTPNStmCatchBase).next_catch_;
  if (this->last_catch_stm_ == (CTPNStmCatch *)0x0) {
    ppCVar1 = &this->first_catch_stm_;
  }
  *ppCVar1 = catch_stm;
  this->last_catch_stm_ = catch_stm;
  (catch_stm->super_CTPNStmCatchBase).next_catch_ = (CTPNStmCatch *)0x0;
  (catch_stm->super_CTPNStmCatchBase).super_CTPNStm.super_CTPNStmBase.next_stm_ = (CTPNStm *)0x0;
  return;
}

Assistant:

void CTPNStmTryBase::add_catch(CTPNStmCatch *catch_stm)
{
    /* link it in at the end of our list */
    if (last_catch_stm_ != 0)
        last_catch_stm_->set_next_catch(catch_stm);
    else
        first_catch_stm_ = catch_stm;

    /* it's now the last catch statement */
    last_catch_stm_ = catch_stm;
    catch_stm->set_next_catch(0);

    /* it's the last statement in its group */
    catch_stm->set_next_stm(0);
}